

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

size_t arith_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  size_t sVar5;
  uint32_t uVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  size_t __n;
  pointer puVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t uVar17;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar24 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  size_t maxv;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  uint32_t *local_50;
  uint32_t *local_48;
  size_t local_40;
  size_t local_38;
  undefined1 auVar18 [32];
  
  auVar20 = in_ZMM3._0_32_;
  local_48 = ibuff;
  count_freqs(&local_68,ibuff,isize,&local_38);
  uVar10 = local_38 + 1;
  auVar21 = vpbroadcastq_avx512f();
  auVar24 = ZEXT1664((undefined1  [16])0x0);
  uVar8 = 0;
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar20 = vpcmpeqd_avx2(auVar20,auVar20);
  do {
    auVar23 = vmovdqa64_avx512f(auVar24);
    auVar24 = vpbroadcastq_avx512f();
    auVar24 = vporq_avx512f(auVar24,auVar22);
    uVar15 = vpcmpuq_avx512f(auVar24,auVar21,2);
    auVar18 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                  (local_68.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar8));
    auVar19._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
    auVar19._0_4_ = (uint)((byte)uVar15 & 1) * auVar18._0_4_;
    auVar19._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
    auVar19._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
    auVar19._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
    auVar19._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
    auVar19._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
    auVar19._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar18._28_4_;
    uVar4 = vptestmd_avx512vl(auVar19,auVar19);
    auVar24 = vpmovm2q_avx512dq(uVar4);
    auVar24 = vpsubq_avx512f(auVar23,auVar24);
    auVar18 = vpsubd_avx2(auVar19,auVar20);
    auVar18 = vmovdqu32_avx512vl(auVar18);
    *(undefined1 (*) [32])
     (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start + uVar8) = auVar18;
    uVar8 = uVar8 + 8;
  } while ((local_38 + (uVar10 == 0) + 8 & 0xfffffffffffffff8) != uVar8);
  auVar21 = vmovdqa64_avx512f(auVar24);
  bVar1 = (bool)((byte)uVar15 & 1);
  auVar22._0_8_ = (ulong)bVar1 * auVar21._0_8_ | (ulong)!bVar1 * auVar23._0_8_;
  bVar1 = (bool)((byte)(uVar15 >> 1) & 1);
  auVar22._8_8_ = (ulong)bVar1 * auVar21._8_8_ | (ulong)!bVar1 * auVar23._8_8_;
  bVar1 = (bool)((byte)(uVar15 >> 2) & 1);
  auVar22._16_8_ = (ulong)bVar1 * auVar21._16_8_ | (ulong)!bVar1 * auVar23._16_8_;
  bVar1 = (bool)((byte)(uVar15 >> 3) & 1);
  auVar22._24_8_ = (ulong)bVar1 * auVar21._24_8_ | (ulong)!bVar1 * auVar23._24_8_;
  bVar1 = (bool)((byte)(uVar15 >> 4) & 1);
  auVar22._32_8_ = (ulong)bVar1 * auVar21._32_8_ | (ulong)!bVar1 * auVar23._32_8_;
  bVar1 = (bool)((byte)(uVar15 >> 5) & 1);
  auVar22._40_8_ = (ulong)bVar1 * auVar21._40_8_ | (ulong)!bVar1 * auVar23._40_8_;
  bVar1 = (bool)((byte)(uVar15 >> 6) & 1);
  auVar22._48_8_ = (ulong)bVar1 * auVar21._48_8_ | (ulong)!bVar1 * auVar23._48_8_;
  auVar22._56_8_ = (uVar15 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar15 >> 7,0) * auVar23._56_8_;
  auVar20 = vextracti64x4_avx512f(auVar22,1);
  auVar21 = vpaddq_avx512f(auVar22,ZEXT3264(auVar20));
  auVar2 = vpaddq_avx(auVar21._0_16_,auVar21._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  uVar8 = local_38 - 1;
  lVar9 = 0;
  do {
    obuff[lVar9] = (uint8_t)uVar8;
    lVar9 = lVar9 + 1;
    uVar8 = uVar8 >> 8;
  } while (lVar9 != 4);
  uVar8 = auVar2._0_8_ - 1;
  lVar9 = 0;
  do {
    obuff[lVar9 + 4] = (uint8_t)uVar8;
    lVar9 = lVar9 + 1;
    uVar8 = uVar8 >> 8;
  } while (lVar9 != 4);
  if (auVar2._0_8_ < 1000) {
    sVar5 = interp_compress(obuff + 8,(size_t)obuff,
                            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,uVar10);
    iVar7 = extraout_EDX;
  }
  else {
    sVar5 = arith_compress(obuff + 8,osize - 8,
                           local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,uVar10);
    iVar7 = extraout_EDX_00;
  }
  scale_counts(&local_68,local_38,iVar7);
  *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  if (local_38 != 0) {
    uVar8 = 2;
    if (2 < uVar10) {
      uVar8 = uVar10;
    }
    uVar6 = *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 1;
    do {
      uVar6 = uVar6 + local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar10];
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = uVar6;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  sVar5 = sVar5 + 8;
  if (isize == 0) {
    uVar17 = '\0';
    uVar12 = 0;
    bVar1 = false;
    uVar10 = 0;
    puVar14 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    sVar11 = 0;
    bVar1 = true;
    uVar10 = 0;
    uVar15 = 0xffffffffffffff;
    uVar12 = 0;
    uVar8 = 0;
    local_50 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      uVar13 = uVar15 >> 0x1f;
      lVar9 = uVar13 * local_50[local_48[sVar11]];
      uVar10 = uVar10 + lVar9;
      uVar15 = uVar15 - lVar9;
      if (-1 < (int)local_50[local_48[sVar11] + 1]) {
        uVar15 = ((ulong)local_50[local_48[sVar11] + 1] - (ulong)local_50[local_48[sVar11]]) *
                 uVar13;
      }
      if (uVar10 < 0x100000000000000) {
        __n = (size_t)uVar12;
      }
      else {
        uVar8 = (ulong)(byte)((char)uVar8 + 1);
        uVar10 = uVar10 & 0xffffffffffffff;
        for (; uVar12 != 0; uVar12 = uVar12 - 1) {
          obuff[sVar5] = (uint8_t)uVar8;
          sVar5 = sVar5 + 1;
          uVar8 = 0;
        }
        __n = 0;
      }
      uVar13 = uVar15;
      local_40 = sVar11;
      if (uVar15 >> 0x30 == 0) {
        do {
          iVar7 = (int)__n;
          if ((~uVar10 & 0xff000000000000) == 0) {
            uVar12 = iVar7 + 1;
          }
          else {
            if (!bVar1) {
              obuff[sVar5] = (uint8_t)uVar8;
              sVar5 = sVar5 + 1;
            }
            uVar8 = uVar10 >> 0x30;
            uVar12 = 0;
            if (iVar7 != 0) {
              memset(obuff + sVar5,0xff,__n);
              sVar5 = sVar5 + 1 + (ulong)(iVar7 - 1);
            }
            bVar1 = false;
          }
          uVar10 = (uVar10 & 0xffffffffffff) << 8;
          uVar15 = uVar13 << 8;
          uVar16 = uVar13 >> 0x28;
          __n = (size_t)uVar12;
          uVar13 = uVar15;
        } while (uVar16 == 0);
      }
      else {
        uVar12 = (uint)__n;
      }
      uVar17 = (uint8_t)uVar8;
      sVar11 = local_40 + 1;
    } while (sVar11 != isize);
    bVar1 = !bVar1;
    puVar14 = local_50;
  }
  if (bVar1) {
    obuff[sVar5] = uVar17;
    sVar5 = sVar5 + 1;
  }
  if (uVar12 != 0) {
    memset(obuff + sVar5,0xff,(ulong)uVar12);
    sVar5 = sVar5 + 1 + (ulong)(uVar12 - 1);
  }
  uVar8 = 0x30;
  do {
    obuff[sVar5] = (uint8_t)(uVar10 >> (uVar8 & 0x3f));
    sVar5 = sVar5 + 1;
    uVar8 = uVar8 - 8;
  } while (uVar8 != 0xfffffffffffffff8);
  operator_delete(puVar14,(long)local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar14);
  return sVar5;
}

Assistant:

size_t arith_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    /* returns the number of bytes written to the output buffer,
           fails/exits if output buffer is too small, provided that
           //myassertion() in enabled */

    /* state variables for encoding */
    uint64_t L = ZERO;
    uint64_t R = FULL;
    uint64_t low, high, total, scale;
    uint32_t v;
    uint8_t last_non_ff_byte = 0, byte;
    uint32_t num_ff_bytes = 0;

    int first = 1;
    size_t op = 0;
    size_t maxv, nunq = 0;

    /* count the frequencies of the provided symbols */
    auto F = count_freqs(ibuff, isize, &maxv);

    /* adjust the counts to allow the interpolative encoder to work */
    for (size_t i = 0; i <= maxv; i++) {
        nunq += (F[i] > 0);
        F[i]++;
    }

    /* now code the prelude into the output buffer */
    op += byte_encode(obuff + op, osize - op, maxv, (1LL << 31));
    op += byte_encode(obuff + op, osize - op, nunq, (1LL << 31));

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        op += interp_compress(obuff + op, osize - op, F.data(), maxv + 1);
    } else {
        /* or else, ta-daa, recursive call for prelude... */
        op += arith_compress(obuff + op, osize - op, F.data(), maxv + 1);
    }

    /* and now scale them up to get total to be a power of two */
    total = scale_counts(F, maxv, 0);

    /* bit ugly to have this next output line coming from here,
           but will do for now */
    /* and turn the adjusted counts in F into cumulative array */
    F[0] = 0;
    for (size_t i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* now encode the array of symbols using the fixed array F to
           control probability estimation, one at a time */
    for (size_t i = 0; i < isize; i++) {
        v = ibuff[i] + 1;

        /* allocated probability range for this symbol */
        low = F[v - 1];
        high = F[v];

        /* this is the actual arithmetic coding step */
        scale = R >> TBTS;
        L += low * scale;
        if (high < total) {
            /* top symbol gets beneit of rounding gaps */
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        /* now sort out the carry/renormalization process */
        if (L > FULL) {
            /* lower bound has overflowed, need first to push
                           a carry through the ff bytes and into the pending
                           non-ff byte */
            last_non_ff_byte += 1;
            L &= FULL;
            while (num_ff_bytes > 0) {
                obuff[op++] = last_non_ff_byte;
                num_ff_bytes--;
                last_non_ff_byte = ZERO;
            }
        }

        /* more normal type of renorm step */
        while (R < PART) {
            /* can output (or rather, save for later output)
                           a byte from the front of L */
            byte = (L >> (BBITS - 8));
            if (byte != FULLBYTE) {
                /* not ff, so can bring everything up to date */
                if (!first) {
                    obuff[op++] = last_non_ff_byte;
                }
                while (num_ff_bytes) {
                    obuff[op++] = FULLBYTE;
                    num_ff_bytes--;
                }
                last_non_ff_byte = byte;
                first = 0;
            } else {
                /* ff bytes just get counted */
                num_ff_bytes++;
            }
            L <<= 8;
            L &= FULL;
            R <<= 8;
        }
    }

    /* wind up: first flush all of the pending bytes */
    if (!first) {
        obuff[op++] = last_non_ff_byte;
    }
    while (num_ff_bytes) {
        obuff[op++] = FULLBYTE;
        num_ff_bytes--;
    }

    /* then send the final bytes from L, to be sure to be sure */
    for (int i = BBYTES - 1; i >= 0; i--) {
        obuff[op++] = (L >> ((8 * i))) & FULLBYTE;
    }

    /* tidy up, and done */
    return op;
}